

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

string * __thiscall
t_java_generator::argument_list_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_struct *tstruct,
          bool include_types)

{
  bool bVar1;
  reference pptVar2;
  t_type *ttype;
  string *psVar3;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_60;
  t_field **local_58;
  byte local_49;
  const_iterator cStack_48;
  bool first;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  allocator local_23;
  undefined1 local_22;
  byte local_21;
  t_struct *ptStack_20;
  bool include_types_local;
  t_struct *tstruct_local;
  t_java_generator *this_local;
  string *result;
  
  local_22 = 0;
  local_21 = include_types;
  ptStack_20 = tstruct;
  tstruct_local = (t_struct *)this;
  this_local = (t_java_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_23);
  std::allocator<char>::~allocator((allocator<char> *)&local_23);
  f_iter._M_current = (t_field **)t_struct::get_members(ptStack_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xffffffffffffffb8);
  local_49 = 1;
  local_58 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_48 = (const_iterator)local_58;
  while( true ) {
    local_60._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffb8,&local_60);
    if (!bVar1) break;
    if ((local_49 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    else {
      local_49 = 0;
    }
    if ((local_21 & 1) != 0) {
      pptVar2 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffffb8);
      ttype = t_field::get_type(*pptVar2);
      type_name_abi_cxx11_(&local_a0,this,ttype,false,false,false,false);
      std::operator+(&local_80,&local_a0," ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xffffffffffffffb8);
    psVar3 = t_field::get_name_abi_cxx11_(*pptVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffffb8);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_java_generator::argument_list(t_struct* tstruct, bool include_types) {
  string result = "";

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      result += ", ";
    }
    if (include_types) {
      result += type_name((*f_iter)->get_type()) + " ";
    }
    result += (*f_iter)->get_name();
  }
  return result;
}